

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O1

int CVmObjDate::parse_date_string
              (int32_t *dayno,int32_t *daytime,char *str,vm_val_t *custom,CVmDateLocale *lc,
              multicaldate_t *cal,int32_t refday,int32_t reftime,CVmTimeZone *reftz,
              date_parse_result *resultp,date_parse_string *fmtlist,int *nfmtlist)

{
  ushort uVar1;
  bool bVar2;
  uint uVar3;
  char *pcVar4;
  date_parse_result *__dest;
  char *pcVar5;
  int32_t *dayno_00;
  int32_t *daytime_00;
  int iVar6;
  int32_t iVar7;
  char *pcVar8;
  void *pvVar9;
  char *pcVar10;
  int *piVar11;
  uint uVar12;
  char *pcVar13;
  char *fmt;
  ulong uVar14;
  ulong uVar15;
  char *curstr;
  size_t curlen;
  size_t filterlen;
  date_parse_result curres;
  format_iter fi;
  int local_428;
  int local_424;
  long local_420;
  char *local_418;
  multicaldate_t *local_410;
  CVmTimeZone *local_408;
  undefined4 local_3fc;
  multicaldate_t *local_3f8;
  char *local_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  int32_t *local_3b0;
  int32_t *local_3a8;
  vm_val_t *local_3a0;
  char *local_398;
  date_parse_string *local_390;
  CVmDateLocale *local_388;
  ulong local_380;
  size_t local_378;
  date_parse_result local_370;
  date_parse_result local_258;
  format_iter local_140;
  undefined1 local_104 [4];
  undefined1 local_100 [208];
  
  piVar11 = nfmtlist;
  uVar1 = *(ushort *)str;
  local_3b0 = dayno;
  local_3a8 = daytime;
  local_3a0 = custom;
  local_388 = lc;
  local_398 = CVmDateLocale::get(lc,&local_378,6);
  local_420 = 0;
  memset(&local_370.pera,0,0xd0);
  local_370.era = 0;
  local_370.yy = -0x80000000;
  local_370.mm = -0x80000000;
  local_370.dd = -0x80000000;
  local_370.mi = -0x80000000;
  local_370.ss = -0x80000000;
  local_370.ms = -0x80000000;
  local_370.tzofs = -0x80000000;
  local_370.w = -0x80000000;
  local_370.yy_needs_century = 0;
  local_370.ampm = 0;
  local_370.hh = -0x80000000;
  local_370.tz = (CVmTimeZone *)0x0;
  local_3f8 = cal;
  local_370.cal = cal;
  if ((ulong)uVar1 != 0) {
    local_420 = 0;
    pcVar10 = str + 2;
    uVar15 = (ulong)uVar1;
    do {
      memset(local_100,0,0xd0);
      format_iter::format_iter(&local_140,parse_date_string::fmt,0x37,local_3a0);
      pcVar8 = format_iter::next(&local_140,(size_t *)&local_418);
      if (pcVar8 == (char *)0x0) {
        local_428 = -0x80000000;
        local_408 = (CVmTimeZone *)0x0;
        local_424 = -0x80000000;
        local_410 = local_3f8;
        uVar3 = 0;
        local_3c8._0_4_ = 0;
        local_3c8._4_4_ = -0x80000000;
        uStack_3c0._0_4_ = -0x80000000;
        uStack_3c0._4_4_ = -0x80000000;
        local_3d8._0_4_ = -0x80000000;
        local_3d8._4_4_ = 0;
        uStack_3d0._0_4_ = 0;
        uStack_3d0._4_4_ = -0x80000000;
        local_3e8._0_4_ = -0x80000000;
        local_3e8._4_4_ = -0x80000000;
        uStack_3e0 = 0;
      }
      else {
        local_390 = fmtlist + local_420;
        local_424 = -0x80000000;
        uVar3 = 0;
        local_410 = local_3f8;
        local_408 = (CVmTimeZone *)0x0;
        local_428 = -0x80000000;
        local_3c8._0_4_ = 0;
        local_3c8._4_4_ = -0x80000000;
        uStack_3c0._0_4_ = -0x80000000;
        uStack_3c0._4_4_ = -0x80000000;
        local_3d8._0_4_ = -0x80000000;
        local_3d8._4_4_ = 0;
        uStack_3d0._0_4_ = 0;
        uStack_3d0._4_4_ = -0x80000000;
        local_3e8._0_4_ = -0x80000000;
        local_3e8._4_4_ = -0x80000000;
        uStack_3e0 = 0;
        do {
          pcVar5 = local_418;
          fmt = pcVar8;
          local_3f0 = pcVar10;
          local_380 = uVar15;
          if ((local_418 < (char *)0x3) || (*pcVar8 != '[')) {
LAB_0028d431:
            memset(&local_258.pera,0,0xd0);
            memcpy(&local_258,&local_370,0x118);
            iVar6 = parse_string_fmt(&local_258,&local_3f0,&local_380,fmt,(size_t)local_418,
                                     local_388);
            if (iVar6 != 0) {
              uVar12 = (int)local_3f0 - (int)pcVar10;
              if ((int)uVar3 < (int)uVar12) {
                local_410 = local_258.cal;
                local_3c8._0_4_ = local_258.era;
                local_3c8._4_4_ = local_258.yy;
                uStack_3c0._0_4_ = local_258.mm;
                uStack_3c0._4_4_ = local_258.dd;
                local_3d8._0_4_ = local_258.w;
                local_3d8._4_4_ = local_258.yy_needs_century;
                uStack_3d0._0_4_ = local_258.ampm;
                uStack_3d0._4_4_ = local_258.hh;
                local_3e8._0_4_ = local_258.mi;
                local_3e8._4_4_ = local_258.ss;
                uStack_3e0 = 0;
                local_424 = local_258.ms;
                local_3fc = local_258._52_4_;
                local_408 = local_258.tz;
                local_428 = local_258.tzofs;
                memcpy(local_104,&local_258.field_0x44,0xd4);
                uVar3 = uVar12;
                if ((nfmtlist != (int *)0x0) && (local_420 < *nfmtlist)) {
                  local_390->p = pcVar8;
                  local_390->len = (size_t)pcVar5;
                }
              }
            }
          }
          else {
            pcVar4 = local_418;
            for (pcVar13 = pcVar8 + 1;
                (pcVar4 = pcVar4 + -1, pcVar4 != (char *)0x0 && (*pcVar13 != '\0'));
                pcVar13 = pcVar13 + 1) {
              if (*pcVar13 == ']') goto LAB_0028d3e0;
            }
            pcVar13 = (char *)0x0;
LAB_0028d3e0:
            if ((pcVar13 == (char *)0x0) ||
               ((pcVar13 + ~(ulong)pcVar8 == (char *)(long)(int)local_378 &&
                (iVar6 = memicmp(pcVar8 + 1,local_398,local_378), iVar6 == 0)))) {
              local_418 = local_418 + (long)(pcVar8 + ~(ulong)pcVar13);
              fmt = pcVar13 + 1;
              bVar2 = true;
            }
            else {
              bVar2 = false;
            }
            if (bVar2) goto LAB_0028d431;
          }
          pcVar8 = format_iter::next(&local_140,(size_t *)&local_418);
        } while (pcVar8 != (char *)0x0);
      }
      pcVar8 = pcVar10;
      uVar14 = uVar15;
      if (uVar3 != 0) {
        pcVar8 = pcVar10 + uVar3;
        local_370.cal = local_410;
        local_370.era = (int)local_3c8;
        local_370.yy = local_3c8._4_4_;
        local_370.mm = (int)uStack_3c0;
        local_370.dd = uStack_3c0._4_4_;
        local_370.w = (int)local_3d8;
        local_370.yy_needs_century = local_3d8._4_4_;
        local_370.ampm = (int)uStack_3d0;
        local_370.hh = uStack_3d0._4_4_;
        local_370.mi = (int)local_3e8;
        local_370.ss = local_3e8._4_4_;
        local_370.ms = local_424;
        local_370._52_4_ = local_3fc;
        local_370.tz = local_408;
        local_370.tzofs = local_428;
        memcpy(&local_370.field_0x44,local_104,0xd4);
        uVar14 = uVar15 - uVar3;
        if (uVar14 != 0) {
          do {
            pvVar9 = memchr(" \t;,:",(int)*pcVar8,6);
            if (pvVar9 == (void *)0x0) goto LAB_0028d699;
            pcVar8 = pcVar8 + 1;
            uVar14 = uVar14 - 1;
          } while (uVar14 != 0);
          uVar14 = 0;
          pcVar8 = pcVar10 + uVar15;
        }
      }
LAB_0028d699:
      if (uVar3 == 0) {
        return 0;
      }
      local_420 = local_420 + 1;
      pcVar10 = pcVar8;
      piVar11 = nfmtlist;
      uVar15 = uVar14;
    } while (uVar14 != 0);
  }
  if (local_370.tz == (CVmTimeZone *)0x0) {
    local_370.tz = reftz;
  }
  date_parse_result::utc_to_local(&local_370,&refday,&reftime);
  date_parse_result::def_date(&local_370,refday);
  __dest = resultp;
  if (local_370.ampm == 2) {
    if (0xb < local_370.hh) goto LAB_0028d734;
    iVar6 = local_370.hh + 0xc;
  }
  else if ((local_370.ampm != 1) || (iVar6 = 0, local_370.hh != 0xc)) goto LAB_0028d734;
  local_370.hh = iVar6;
LAB_0028d734:
  iVar7 = date_parse_result::dayno(&local_370);
  daytime_00 = local_3a8;
  dayno_00 = local_3b0;
  *local_3b0 = iVar7;
  *local_3a8 = local_370.ss * 1000 + local_370.mi * 60000 + local_370.hh * 3600000 + local_370.ms;
  caldate_t::normalize(local_3b0,local_3a8);
  date_parse_result::local_to_utc(&local_370,dayno_00,daytime_00);
  if (__dest != (date_parse_result *)0x0) {
    memcpy(__dest,&local_370,0x118);
  }
  if (piVar11 != (int *)0x0) {
    *piVar11 = (int)local_420;
  }
  return 1;
}

Assistant:

int CVmObjDate::parse_date_string(
    VMG_ int32_t &dayno, int32_t &daytime,
    const char *str, const vm_val_t *custom, CVmDateLocale *lc,
    multicaldate_t *cal, int32_t refday, int32_t reftime, CVmTimeZone *reftz,
    date_parse_result *resultp, date_parse_string *fmtlist, int *nfmtlist)
{
    /* get the string length and buffer */
    size_t len = vmb_get_len(str);
    str += VMB_LEN;

    /* format list */
    static const char *fmt[] =
    {
        /* US-style dates, with the month first */
        "[us]m / d / y",
        "[us]m / d",
        "[us]m - d",
        "[us]m . d",
        "[us]m .\t- d .\t- y",

        /* European-style date formats, with day/month order */
        "[eu]d / m / y",
        "[eu]d / m",
        "[eu]d - m",
        "[eu]d . m",
        "[eu]d .\t- m .\t- y",

        /* match some special computer formats first */
        "yyyy mm dd",                             /* 8-digit year month day */
        "yyyy .? doy",                   /* PostreSQL year with day-of-year */

        /* universal date formats */
        "m / y",
        "m - y",
        "month _.\t-* ddth _,.\t+ ye",
        "ddth _.\t-* month _,.\t-* ye",
        "month _.\t-* ddth",
        "ddth _.\t-* month",
        "month - dd - ye",
        "month _\t.-* y",
        "month",
        "+- y - mm - dd",
        "y / m / d",
        "y - m - d",
        "y / m",
        "y - m",
        "ye _\t.-* month _\t.-* d",
        "ye _\t.-* month",
        "ye - month - dd",
        "yyyy",
        "era _* y",
        "y _* era",

        /* time formats */
        "h _? ampm",
        "h : mi",
        "h .: mi _? ampm",
        "h .: mi .: ss _? ampm",
        "h : mi : ss",
        "h : mi : ss .: ssfrac _? ampm",
        "h : mi : ss .: ssfrac",
        "tT? hh .: mi",
        "tT? hh mi",
        "tT? hh .: mi .: ss",
        "tT? hh mi SS",
        "tT? hh .: mi .: ss _? tz",
        "tT? hh .: mi .: ss . ssfrac",
        "tz",

        /* special formats (ISO, other software, etc) */
        "d / mon / yyyy : hh : mi : ss _ gmtofs",         /* Unix log files */
        "yyyy : mm : dd _ hh : mi : ss",                            /* EXIF */
        "yyyy -? \\W W",                          /* ISO year with ISO week */
        "yyyy - mm - dd \\T hh : mi : ss . ssfrac",                 /* SOAP */
        "yyyy - mm - dd \\T hh : mi : ss . ssfrac gmtofs",          /* SOAP */
        "@ unix",                                         /* Unix timestamp */
        "yyyy mm dd \\T hh : mi : ss",                            /* XMLRPC */
        "yyyy mm dd \\t hh mi ss",                      /* XMLRPC - compact */
        "yyyy - m - d \\T h : i : s"                                /* WDDX */
    };

    /* get the template filter in "[xx]" format */
    size_t filterlen;
    const char *filter = lc->get(vmg_ filterlen, LC_PARSE_FILTER);
    
    /* keep separate results for each pass */
    date_parse_result result(cal);

    /*
     *   Run through the format list as many times as it takes to either
     *   consume the whole source string, or fail to find a matching format.
     *   We have multiple format parts that can be specified individually or
     *   in combination (time, date, time + date, date + time, etc).
     */
    int fcapi;
    for (fcapi = 0 ; len != 0 ; ++fcapi)
    {
        /* we haven't found a best result for this pass yet */
        int bestlen = 0;
        date_parse_result bestres(cal);
        
        /* search the list for a match */
        format_iter fi(vmg_ fmt, countof(fmt), custom);
        size_t curfmtl;
        const char *curfmt;
        while ((curfmt = fi.next(vmg_ curfmtl)) != 0)
        {
            /* set up at the current position */
            const char *curstr = str;
            size_t curlen = len;

            /* remember the original format string */
            const char *curfmt0 = curfmt;
            size_t curfmtl0 = curfmtl;

            /* if this is a "[us]" or "[eu]" local entry, filter it */
            if (curfmtl >= 3 && curfmt[0] == '[')
            {
                /* get the ']' */
                const char *rb = lib_strnchr(curfmt+1, curfmtl-1, ']');

                /* 
                 *   if we found it, and the contents of the brackets don't
                 *   match the locale filter string, filter out this format 
                 */
                if (rb != 0
                    && (rb - curfmt - 1 != (int)filterlen
                        || memicmp(curfmt + 1, filter, filterlen) != 0))
                    continue;

                /* skip the filter string */
                curfmtl -= rb - curfmt + 1;
                curfmt = rb + 1;
            }

            /* start with the results from previous passes */
            date_parse_result curres(result);

            /* try matching this format at the current position */
            if (parse_string_fmt(vmg_ &curres, curstr, curlen,
                                 curfmt, curfmtl, lc))
            {
                /* if this is the longest match of this pass, keep it */
                int reslen = curstr - str;
                if (reslen > bestlen)
                {
                    /* remember this as the best result so far */
                    bestlen = reslen;
                    bestres = curres;

                    /* remember the format string it matches, if desired */
                    if (nfmtlist != 0 && fcapi < *nfmtlist)
                        fmtlist[fcapi].set(curfmt0, curfmtl0);
                }
            }
        }

        /* if we didn't find a match on this round, we've failed */
        if (bestlen == 0)
            return FALSE;

        /* skip what we matched for the best result of this pass */
        str += bestlen;
        len -= bestlen;

        /* keep the best result for this pass */
        result = bestres;

        /* skip spaces and other separator characters */
        for ( ; len != 0 && strchr(" \t;,:", *str) != 0 ; ++str, --len) ;
    }

    /* default to the reference time zone */
    result.def_tz(reftz);

    /* adjust the reference time to the appropriate local time zone */
    result.utc_to_local(refday, reftime);

    /* set missing date elements to the corresponding reference date values */
    result.def_date(refday);
    
    /* set any missing time elements to midnight or zero past the hour/min */
    result.def_time(0, 0, 0, 0);

    /* convert to our internal day and time representation */
    dayno = result.dayno();
    daytime = result.daytime();
    caldate_t::normalize(dayno, daytime);

    /* translate the final time value from the specified local time to UTC */
    result.local_to_utc(dayno, daytime);

    /* copy back the results if the caller's interested */
    if (resultp != 0)
        memcpy(resultp, &result, sizeof(result));

    /* tell the caller how many format strings we matched, if desired */
    if (nfmtlist != 0)
        *nfmtlist = fcapi;

    /* success */
    return TRUE;
}